

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PPointer::ReadValue(PPointer *this,FSerializer *ar,char *key,void *addr)

{
  bool bVar1;
  bool local_31;
  DObject **ppDStack_30;
  bool res;
  void *addr_local;
  char *key_local;
  FSerializer *ar_local;
  PPointer *this_local;
  
  ppDStack_30 = (DObject **)addr;
  addr_local = key;
  key_local = (char *)ar;
  ar_local = (FSerializer *)this;
  bVar1 = DObject::IsKindOf((DObject *)this->PointedType,PClass::RegistrationInfo.MyClass);
  if (bVar1) {
    local_31 = false;
    ::Serialize((FSerializer *)key_local,(char *)addr_local,ppDStack_30,(DObject **)0x0,&local_31);
    this_local._7_1_ = (bool)(local_31 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PPointer::ReadValue(FSerializer &ar, const char *key, void *addr) const
{
	if (PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		bool res = false;
		::Serialize(ar, key, *(DObject **)addr, nullptr, &res);
		return res;
	}
	return false;
}